

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O0

int trico_read_stl(uint32_t *nr_of_vertices,float **vertices,uint32_t *nr_of_triangles,
                  uint32_t **triangles,char *filename)

{
  float fVar1;
  int iVar2;
  FILE *__stream;
  uint32_t *puVar3;
  float *pfVar4;
  bool bVar5;
  float *local_b0;
  float *vert_it;
  uint32_t *tria_it;
  char local_98;
  char local_97;
  char local_96;
  char local_95;
  uint32_t count_triangles;
  char buffer [80];
  FILE *inputfile;
  char *filename_local;
  uint32_t **triangles_local;
  uint32_t *nr_of_triangles_local;
  float **vertices_local;
  uint32_t *nr_of_vertices_local;
  
  *vertices = (float *)0x0;
  *triangles = (uint32_t *)0x0;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    nr_of_vertices_local._4_4_ = 0;
  }
  else if (__stream == (FILE *)0x0) {
    nr_of_vertices_local._4_4_ = 0;
  }
  else {
    fread(&local_98,1,0x50,__stream);
    if ((((local_98 == 's') && (local_97 == 'o')) && (local_96 == 'l')) &&
       ((local_95 == 'i' && ((char)count_triangles == 'd')))) {
      fclose(__stream);
      nr_of_vertices_local._4_4_ = 0;
    }
    else {
      fread(nr_of_triangles,4,1,__stream);
      puVar3 = (uint32_t *)trico_malloc((ulong)(*nr_of_triangles * 3) << 2);
      *triangles = puVar3;
      tria_it._4_4_ = 0;
      *nr_of_vertices = 0;
      pfVar4 = (float *)trico_malloc((ulong)(*nr_of_triangles * 9) << 2);
      *vertices = pfVar4;
      vert_it = (float *)*triangles;
      local_b0 = *vertices;
      while( true ) {
        iVar2 = feof(__stream);
        bVar5 = false;
        if (iVar2 == 0) {
          bVar5 = tria_it._4_4_ < *nr_of_triangles;
        }
        if (!bVar5) break;
        tria_it._4_4_ = tria_it._4_4_ + 1;
        fread(&local_98,1,0x32,__stream);
        *local_b0 = (float)buffer._4_4_;
        local_b0[1] = (float)buffer._8_4_;
        local_b0[2] = (float)buffer._12_4_;
        local_b0[3] = (float)buffer._16_4_;
        local_b0[4] = (float)buffer._20_4_;
        local_b0[5] = (float)buffer._24_4_;
        local_b0[6] = (float)buffer._28_4_;
        pfVar4 = local_b0 + 8;
        local_b0[7] = (float)buffer._32_4_;
        local_b0 = local_b0 + 9;
        *pfVar4 = (float)buffer._36_4_;
        fVar1 = (float)*nr_of_vertices;
        *nr_of_vertices = (int)fVar1 + 1;
        *vert_it = fVar1;
        fVar1 = (float)*nr_of_vertices;
        *nr_of_vertices = (int)fVar1 + 1;
        pfVar4 = vert_it + 2;
        vert_it[1] = fVar1;
        fVar1 = (float)*nr_of_vertices;
        *nr_of_vertices = (int)fVar1 + 1;
        vert_it = vert_it + 3;
        *pfVar4 = fVar1;
      }
      fclose(__stream);
      if (tria_it._4_4_ == *nr_of_triangles) {
        trico_remove_duplicate_vertices(nr_of_vertices,vertices,*nr_of_triangles,triangles);
        pfVar4 = (float *)trico_realloc(*vertices,(ulong)(*nr_of_vertices * 3) << 2);
        *vertices = pfVar4;
        nr_of_vertices_local._4_4_ = 1;
      }
      else {
        nr_of_vertices_local._4_4_ = 0;
      }
    }
  }
  return nr_of_vertices_local._4_4_;
}

Assistant:

int trico_read_stl(uint32_t* nr_of_vertices, float** vertices, uint32_t* nr_of_triangles, uint32_t** triangles, const char* filename)
  {
  *vertices = NULL;
  *triangles = NULL;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  FILE* inputfile = fopen(filename, "rb");
  if (!inputfile)
    return 0;

  if (!inputfile)
    return 0;

  char buffer[80];
  fread(buffer, 1, 80, inputfile);

  if (buffer[0] == 's' && buffer[1] == 'o' && buffer[2] == 'l' && buffer[3] == 'i' && buffer[4] == 'd')
    {
    fclose(inputfile);
    return 0;
    }

  fread((void*)(nr_of_triangles), sizeof(uint32_t), 1, inputfile);
  *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));
  uint32_t count_triangles = 0;
  *nr_of_vertices = 0;
  *vertices = (float*)trico_malloc(*nr_of_triangles * 9 * sizeof(float));

  uint32_t* tria_it = *triangles;
  float* vert_it = *vertices;
  while (!feof(inputfile) && count_triangles < *nr_of_triangles)
    {
    ++count_triangles;
    fread(buffer, 1, 50, inputfile);
    *vert_it++ = *(float*)(&(buffer[12]));
    *vert_it++ = *(float*)(&(buffer[16]));
    *vert_it++ = *(float*)(&(buffer[20]));
    *vert_it++ = *(float*)(&(buffer[24]));
    *vert_it++ = *(float*)(&(buffer[28]));
    *vert_it++ = *(float*)(&(buffer[32]));
    *vert_it++ = *(float*)(&(buffer[36]));
    *vert_it++ = *(float*)(&(buffer[40]));
    *vert_it++ = *(float*)(&(buffer[44]));
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    }
  fclose(inputfile);
  if (count_triangles != *nr_of_triangles)
    return 0;

  trico_remove_duplicate_vertices(nr_of_vertices, vertices, *nr_of_triangles, triangles);
  *vertices = (float*)trico_realloc(*vertices, *nr_of_vertices * 3 * sizeof(float));
  return 1;
  }